

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

UINT32 calculateChecksum32(UINT32 *buffer,UINT32 bufferSize)

{
  int iVar1;
  ulong uVar2;
  
  if (buffer != (UINT32 *)0x0) {
    iVar1 = 0;
    for (uVar2 = 0; bufferSize >> 2 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = iVar1 + buffer[uVar2];
    }
    return -iVar1;
  }
  return 0;
}

Assistant:

UINT32 calculateChecksum32(const UINT32* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT32 counter = 0;
    UINT32 index = 0;
    
    bufferSize /= sizeof(UINT32);
    
    for (; index < bufferSize; index++) {
        counter = (UINT32)(counter + buffer[index]);
    }
    
    return (UINT32)(0x100000000ULL - counter);
}